

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Scene *pSVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  Geometry *pGVar15;
  RTCIntersectArguments *pRVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong unaff_R12;
  size_t mask;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 uVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_ba0;
  int local_b74;
  ulong local_b70;
  RayQueryContext *local_b68;
  ulong local_b60;
  ulong local_b58;
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  float local_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  ulong local_b00;
  Ray *local_af8;
  ulong local_af0;
  ulong local_ae8;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  uint local_ac8;
  uint local_ac4;
  uint local_ac0;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  byte local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  ulong local_800 [250];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar74 = ray->tfar;
    if (0.0 <= fVar74) {
      local_ba0 = local_800 + 1;
      aVar8 = (ray->dir).field_0;
      auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx512vl((undefined1  [16])aVar8,auVar35);
      auVar36._8_4_ = 0x219392ef;
      auVar36._0_8_ = 0x219392ef219392ef;
      auVar36._12_4_ = 0x219392ef;
      uVar30 = vcmpps_avx512vl(auVar35,auVar36,1);
      auVar69._8_4_ = 0x3f800000;
      auVar69._0_8_ = &DAT_3f8000003f800000;
      auVar69._12_4_ = 0x3f800000;
      local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar35 = vdivps_avx(auVar69,(undefined1  [16])aVar8);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar34 = (bool)((byte)uVar30 & 1);
      auVar39._0_4_ = (uint)bVar34 * auVar36._0_4_ | (uint)!bVar34 * auVar35._0_4_;
      bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar34 * auVar36._4_4_ | (uint)!bVar34 * auVar35._4_4_;
      bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar34 * auVar36._8_4_ | (uint)!bVar34 * auVar35._8_4_;
      bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar34 * auVar36._12_4_ | (uint)!bVar34 * auVar35._12_4_;
      auVar37._8_4_ = 0x3f7ffffa;
      auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar37._12_4_ = 0x3f7ffffa;
      auVar37 = vmulps_avx512vl(auVar39,auVar37);
      auVar38._8_4_ = 0x3f800003;
      auVar38._0_8_ = 0x3f8000033f800003;
      auVar38._12_4_ = 0x3f800003;
      auVar38 = vmulps_avx512vl(auVar39,auVar38);
      auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar81 = ZEXT1664(auVar35);
      auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar82 = ZEXT1664(auVar35);
      auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar83 = ZEXT1664(auVar35);
      auVar35 = vbroadcastss_avx512vl(auVar37);
      auVar84 = ZEXT1664(auVar35);
      auVar35 = vmovshdup_avx(auVar37);
      auVar36 = vshufps_avx512vl(auVar37,auVar37,0x55);
      auVar85 = ZEXT1664(auVar36);
      auVar36 = vshufpd_avx(auVar37,auVar37,1);
      auVar39 = vshufps_avx512vl(auVar37,auVar37,0xaa);
      auVar86 = ZEXT1664(auVar39);
      fVar64 = auVar38._0_4_;
      local_b20 = vshufps_avx(auVar38,auVar38,0x55);
      auVar77 = ZEXT1664(local_b20);
      local_b30 = vshufps_avx(auVar38,auVar38,0xaa);
      auVar79 = ZEXT1664(local_b30);
      uVar30 = (ulong)(auVar37._0_4_ < 0.0) << 4;
      local_b70 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x20;
      uVar32 = (ulong)(auVar36._0_4_ < 0.0) << 4 | 0x40;
      uVar33 = uVar30 ^ 0x10;
      uVar26 = local_b70 ^ 0x10;
      uVar29 = uVar32 ^ 0x10;
      uVar67 = auVar40._0_4_;
      local_b40._4_4_ = uVar67;
      local_b40._0_4_ = uVar67;
      local_b40._8_4_ = uVar67;
      local_b40._12_4_ = uVar67;
      auVar71 = ZEXT1664(local_b40);
      local_b50._4_4_ = fVar74;
      local_b50._0_4_ = fVar74;
      local_b50._8_4_ = fVar74;
      local_b50._12_4_ = fVar74;
      auVar72 = ZEXT1664(local_b50);
      local_b10 = fVar64;
      fStack_b0c = fVar64;
      fStack_b08 = fVar64;
      fStack_b04 = fVar64;
      local_b58 = uVar32;
      local_b60 = uVar33;
      local_b68 = context;
      fVar74 = fVar64;
      fVar75 = fVar64;
      fVar76 = fVar64;
      do {
        if (local_ba0 == local_800) {
          return;
        }
        uVar28 = local_ba0[-1];
        local_ba0 = local_ba0 + -1;
        do {
          if ((uVar28 & 8) == 0) {
            auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar30),auVar81._0_16_)
            ;
            auVar35 = vmulps_avx512vl(auVar84._0_16_,auVar35);
            auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + local_b70),
                                      auVar82._0_16_);
            auVar40 = vmulps_avx512vl(auVar85._0_16_,auVar40);
            auVar35 = vmaxps_avx(auVar35,auVar40);
            auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar32),auVar83._0_16_)
            ;
            auVar40 = vmulps_avx512vl(auVar86._0_16_,auVar40);
            auVar40 = vmaxps_avx(auVar40,auVar71._0_16_);
            auVar35 = vmaxps_avx(auVar35,auVar40);
            auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar33),auVar81._0_16_)
            ;
            auVar63._0_4_ = fVar64 * auVar40._0_4_;
            auVar63._4_4_ = fVar74 * auVar40._4_4_;
            auVar63._8_4_ = fVar75 * auVar40._8_4_;
            auVar63._12_4_ = fVar76 * auVar40._12_4_;
            auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar26),auVar82._0_16_)
            ;
            auVar65._0_4_ = auVar77._0_4_ * auVar40._0_4_;
            auVar65._4_4_ = auVar77._4_4_ * auVar40._4_4_;
            auVar65._8_4_ = auVar77._8_4_ * auVar40._8_4_;
            auVar65._12_4_ = auVar77._12_4_ * auVar40._12_4_;
            auVar40 = vminps_avx(auVar63,auVar65);
            auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar29),auVar83._0_16_)
            ;
            auVar66._0_4_ = auVar79._0_4_ * auVar36._0_4_;
            auVar66._4_4_ = auVar79._4_4_ * auVar36._4_4_;
            auVar66._8_4_ = auVar79._8_4_ * auVar36._8_4_;
            auVar66._12_4_ = auVar79._12_4_ * auVar36._12_4_;
            auVar36 = vminps_avx(auVar66,auVar72._0_16_);
            auVar40 = vminps_avx(auVar40,auVar36);
            uVar18 = vcmpps_avx512vl(auVar35,auVar40,2);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar18);
          }
          if ((uVar28 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar31 = 4;
            }
            else {
              uVar27 = uVar28 & 0xfffffffffffffff0;
              lVar25 = 0;
              for (uVar28 = unaff_R12; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
              {
                lVar25 = lVar25 + 1;
              }
              iVar31 = 0;
              for (uVar23 = unaff_R12 - 1 & unaff_R12; uVar28 = *(ulong *)(uVar27 + lVar25 * 8),
                  uVar23 != 0; uVar23 = uVar23 - 1 & uVar23) {
                *local_ba0 = uVar28;
                local_ba0 = local_ba0 + 1;
                lVar25 = 0;
                for (uVar28 = uVar23; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  lVar25 = lVar25 + 1;
                }
              }
            }
          }
          else {
            iVar31 = 6;
          }
        } while (iVar31 == 0);
        if (iVar31 == 6) {
          iVar31 = 0;
          local_af0 = (ulong)((uint)uVar28 & 0xf) - 8;
          bVar34 = local_af0 != 0;
          if (bVar34) {
            uVar28 = uVar28 & 0xfffffffffffffff0;
            pSVar9 = local_b68->scene;
            local_ae8 = 0;
            do {
              lVar24 = local_ae8 * 0x60;
              ppfVar10 = (pSVar9->vertices).items;
              pfVar11 = ppfVar10[*(uint *)(uVar28 + 0x48 + lVar24)];
              auVar43._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar28 + 0x28 + lVar24));
              auVar43._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar28 + 8 + lVar24));
              pfVar12 = ppfVar10[*(uint *)(uVar28 + 0x40 + lVar24)];
              auVar44._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar28 + 0x20 + lVar24));
              auVar44._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar28 + lVar24));
              pfVar13 = ppfVar10[*(uint *)(uVar28 + 0x4c + lVar24)];
              auVar49._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar28 + 0x2c + lVar24));
              auVar49._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar28 + 0xc + lVar24));
              pfVar14 = ppfVar10[*(uint *)(uVar28 + 0x44 + lVar24)];
              auVar51._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar28 + 0x24 + lVar24));
              auVar51._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar28 + 4 + lVar24));
              lVar25 = uVar28 + 0x40 + lVar24;
              local_9e0 = *(undefined8 *)(lVar25 + 0x10);
              uStack_9d8 = *(undefined8 *)(lVar25 + 0x18);
              uStack_9d0 = local_9e0;
              uStack_9c8 = uStack_9d8;
              lVar25 = uVar28 + 0x50 + lVar24;
              local_a00 = *(undefined8 *)(lVar25 + 0x10);
              uStack_9f8 = *(undefined8 *)(lVar25 + 0x18);
              auVar36 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar28 + 0x10 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar28 + 0x18 + lVar24)));
              auVar35 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar28 + 0x10 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar28 + 0x18 + lVar24)));
              auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar28 + 0x14 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar28 + 0x1c + lVar24)));
              auVar40 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar28 + 0x14 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar28 + 0x1c + lVar24)));
              auVar38 = vunpcklps_avx(auVar35,auVar40);
              auVar39 = vunpcklps_avx(auVar36,auVar37);
              auVar35 = vunpckhps_avx(auVar36,auVar37);
              auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar28 + 0x30 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar28 + 0x38 + lVar24)));
              auVar40 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar28 + 0x30 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar28 + 0x38 + lVar24)));
              auVar69 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar28 + 0x34 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar28 + 0x3c + lVar24)));
              auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar28 + 0x34 + lVar24)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar28 + 0x3c + lVar24)));
              auVar36 = vunpcklps_avx(auVar40,auVar36);
              auVar63 = vunpcklps_avx(auVar37,auVar69);
              auVar40 = vunpckhps_avx(auVar37,auVar69);
              uStack_9f0 = local_a00;
              uStack_9e8 = uStack_9f8;
              auVar62 = vunpcklps_avx(auVar51,auVar49);
              auVar61 = vunpcklps_avx(auVar44,auVar43);
              auVar46 = vunpcklps_avx(auVar61,auVar62);
              auVar61 = vunpckhps_avx(auVar61,auVar62);
              auVar62 = vunpckhps_avx(auVar51,auVar49);
              auVar45 = vunpckhps_avx(auVar44,auVar43);
              auVar45 = vunpcklps_avx(auVar45,auVar62);
              auVar48._16_16_ = auVar39;
              auVar48._0_16_ = auVar39;
              auVar52._16_16_ = auVar35;
              auVar52._0_16_ = auVar35;
              auVar47._16_16_ = auVar38;
              auVar47._0_16_ = auVar38;
              auVar53._16_16_ = auVar63;
              auVar53._0_16_ = auVar63;
              auVar54._16_16_ = auVar40;
              auVar54._0_16_ = auVar40;
              uVar67 = *(undefined4 *)&(ray->org).field_0;
              auVar55._4_4_ = uVar67;
              auVar55._0_4_ = uVar67;
              auVar55._8_4_ = uVar67;
              auVar55._12_4_ = uVar67;
              auVar55._16_4_ = uVar67;
              auVar55._20_4_ = uVar67;
              auVar55._24_4_ = uVar67;
              auVar55._28_4_ = uVar67;
              auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
              auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
              uVar67 = *(undefined4 *)&(ray->dir).field_0;
              auVar70._4_4_ = uVar67;
              auVar70._0_4_ = uVar67;
              auVar70._8_4_ = uVar67;
              auVar70._12_4_ = uVar67;
              auVar70._16_4_ = uVar67;
              auVar70._20_4_ = uVar67;
              auVar70._24_4_ = uVar67;
              auVar70._28_4_ = uVar67;
              auVar50._16_16_ = auVar36;
              auVar50._0_16_ = auVar36;
              uVar67 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar73._4_4_ = uVar67;
              auVar73._0_4_ = uVar67;
              auVar73._8_4_ = uVar67;
              auVar73._12_4_ = uVar67;
              auVar73._16_4_ = uVar67;
              auVar73._20_4_ = uVar67;
              auVar73._24_4_ = uVar67;
              auVar73._28_4_ = uVar67;
              fVar7 = (ray->dir).field_0.m128[2];
              auVar78._4_4_ = fVar7;
              auVar78._0_4_ = fVar7;
              auVar78._8_4_ = fVar7;
              auVar78._12_4_ = fVar7;
              auVar78._16_4_ = fVar7;
              auVar78._20_4_ = fVar7;
              auVar78._24_4_ = fVar7;
              auVar78._28_4_ = fVar7;
              auVar62 = vsubps_avx(auVar46,auVar55);
              auVar43 = vsubps_avx512vl(auVar61,auVar41);
              auVar44 = vsubps_avx512vl(auVar45,auVar42);
              auVar45 = vsubps_avx512vl(auVar48,auVar55);
              auVar46 = vsubps_avx512vl(auVar52,auVar41);
              auVar47 = vsubps_avx512vl(auVar47,auVar42);
              auVar48 = vsubps_avx512vl(auVar53,auVar55);
              auVar49 = vsubps_avx512vl(auVar54,auVar41);
              auVar50 = vsubps_avx512vl(auVar50,auVar42);
              auVar51 = vsubps_avx512vl(auVar48,auVar62);
              auVar61 = vsubps_avx(auVar49,auVar43);
              auVar52 = vsubps_avx512vl(auVar50,auVar44);
              auVar53 = vsubps_avx512vl(auVar62,auVar45);
              auVar54 = vsubps_avx512vl(auVar43,auVar46);
              auVar55 = vsubps_avx512vl(auVar44,auVar47);
              auVar56 = vsubps_avx512vl(auVar45,auVar48);
              auVar57 = vsubps_avx512vl(auVar46,auVar49);
              auVar58 = vsubps_avx512vl(auVar47,auVar50);
              auVar42 = vaddps_avx512vl(auVar48,auVar62);
              auVar80._0_4_ = auVar49._0_4_ + auVar43._0_4_;
              auVar80._4_4_ = auVar49._4_4_ + auVar43._4_4_;
              auVar80._8_4_ = auVar49._8_4_ + auVar43._8_4_;
              auVar80._12_4_ = auVar49._12_4_ + auVar43._12_4_;
              auVar80._16_4_ = auVar49._16_4_ + auVar43._16_4_;
              auVar80._20_4_ = auVar49._20_4_ + auVar43._20_4_;
              auVar80._24_4_ = auVar49._24_4_ + auVar43._24_4_;
              auVar80._28_4_ = auVar49._28_4_ + auVar43._28_4_;
              auVar41 = vaddps_avx512vl(auVar50,auVar44);
              auVar59 = vmulps_avx512vl(auVar80,auVar52);
              auVar59 = vfmsub231ps_avx512vl(auVar59,auVar61,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar51);
              auVar60 = vfmsub231ps_avx512vl(auVar41,auVar52,auVar42);
              auVar41._4_4_ = auVar61._4_4_ * auVar42._4_4_;
              auVar41._0_4_ = auVar61._0_4_ * auVar42._0_4_;
              auVar41._8_4_ = auVar61._8_4_ * auVar42._8_4_;
              auVar41._12_4_ = auVar61._12_4_ * auVar42._12_4_;
              auVar41._16_4_ = auVar61._16_4_ * auVar42._16_4_;
              auVar41._20_4_ = auVar61._20_4_ * auVar42._20_4_;
              auVar41._24_4_ = auVar61._24_4_ * auVar42._24_4_;
              auVar41._28_4_ = auVar42._28_4_;
              auVar35 = vfmsub231ps_fma(auVar41,auVar51,auVar80);
              auVar68._0_4_ = fVar7 * auVar35._0_4_;
              auVar68._4_4_ = fVar7 * auVar35._4_4_;
              auVar68._8_4_ = fVar7 * auVar35._8_4_;
              auVar68._12_4_ = fVar7 * auVar35._12_4_;
              auVar68._16_4_ = fVar7 * 0.0;
              auVar68._20_4_ = fVar7 * 0.0;
              auVar68._24_4_ = fVar7 * 0.0;
              auVar68._28_4_ = 0;
              auVar41 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar60);
              local_9c0 = vfmadd231ps_avx512vl(auVar41,auVar70,auVar59);
              auVar41 = vaddps_avx512vl(auVar62,auVar45);
              auVar42 = vaddps_avx512vl(auVar43,auVar46);
              auVar59 = vaddps_avx512vl(auVar44,auVar47);
              auVar60 = vmulps_avx512vl(auVar42,auVar55);
              auVar60 = vfmsub231ps_avx512vl(auVar60,auVar54,auVar59);
              auVar59 = vmulps_avx512vl(auVar59,auVar53);
              auVar59 = vfmsub231ps_avx512vl(auVar59,auVar55,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar54);
              auVar41 = vfmsub231ps_avx512vl(auVar41,auVar53,auVar42);
              auVar42._4_4_ = fVar7 * auVar41._4_4_;
              auVar42._0_4_ = fVar7 * auVar41._0_4_;
              auVar42._8_4_ = fVar7 * auVar41._8_4_;
              auVar42._12_4_ = fVar7 * auVar41._12_4_;
              auVar42._16_4_ = fVar7 * auVar41._16_4_;
              auVar42._20_4_ = fVar7 * auVar41._20_4_;
              auVar42._24_4_ = fVar7 * auVar41._24_4_;
              auVar42._28_4_ = auVar41._28_4_;
              auVar41 = vfmadd231ps_avx512vl(auVar42,auVar73,auVar59);
              local_9a0 = vfmadd231ps_avx512vl(auVar41,auVar70,auVar60);
              auVar45 = vaddps_avx512vl(auVar45,auVar48);
              auVar46 = vaddps_avx512vl(auVar46,auVar49);
              auVar41 = vaddps_avx512vl(auVar47,auVar50);
              auVar42 = vmulps_avx512vl(auVar46,auVar58);
              auVar42 = vfmsub231ps_avx512vl(auVar42,auVar57,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar56);
              auVar41 = vfmsub231ps_avx512vl(auVar41,auVar58,auVar45);
              auVar45 = vmulps_avx512vl(auVar45,auVar57);
              auVar45 = vfmsub231ps_avx512vl(auVar45,auVar56,auVar46);
              auVar45 = vmulps_avx512vl(auVar78,auVar45);
              auVar45 = vfmadd231ps_avx512vl(auVar45,auVar73,auVar41);
              auVar41 = vfmadd231ps_avx512vl(auVar45,auVar70,auVar42);
              auVar59._0_4_ = local_9a0._0_4_ + local_9c0._0_4_;
              auVar59._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
              auVar59._8_4_ = local_9a0._8_4_ + local_9c0._8_4_;
              auVar59._12_4_ = local_9a0._12_4_ + local_9c0._12_4_;
              auVar59._16_4_ = local_9a0._16_4_ + local_9c0._16_4_;
              auVar59._20_4_ = local_9a0._20_4_ + local_9c0._20_4_;
              auVar59._24_4_ = local_9a0._24_4_ + local_9c0._24_4_;
              auVar59._28_4_ = local_9a0._28_4_ + local_9c0._28_4_;
              local_980 = vaddps_avx512vl(auVar41,auVar59);
              local_a20 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(local_980,local_a20);
              auVar45._8_4_ = 0x34000000;
              auVar45._0_8_ = 0x3400000034000000;
              auVar45._12_4_ = 0x34000000;
              auVar45._16_4_ = 0x34000000;
              auVar45._20_4_ = 0x34000000;
              auVar45._24_4_ = 0x34000000;
              auVar45._28_4_ = 0x34000000;
              auVar45 = vmulps_avx512vl(local_a20,auVar45);
              auVar46 = vminps_avx512vl(local_9c0,local_9a0);
              auVar42 = vminps_avx512vl(auVar46,auVar41);
              auVar46._8_4_ = 0x80000000;
              auVar46._0_8_ = 0x8000000080000000;
              auVar46._12_4_ = 0x80000000;
              auVar46._16_4_ = 0x80000000;
              auVar46._20_4_ = 0x80000000;
              auVar46._24_4_ = 0x80000000;
              auVar46._28_4_ = 0x80000000;
              auVar46 = vxorps_avx512vl(auVar45,auVar46);
              uVar18 = vcmpps_avx512vl(auVar42,auVar46,5);
              auVar46 = vmaxps_avx512vl(local_9c0,local_9a0);
              auVar46 = vmaxps_avx512vl(auVar46,auVar41);
              uVar19 = vcmpps_avx512vl(auVar46,auVar45,2);
              local_900 = (byte)uVar18 | (byte)uVar19;
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              fVar74 = fStack_b0c;
              fVar75 = fStack_b08;
              fVar76 = fStack_b04;
              fVar64 = local_b10;
              if (local_900 == 0) {
LAB_007156f5:
                auVar77 = ZEXT1664(local_b20);
                auVar79 = ZEXT1664(local_b30);
                auVar71 = ZEXT1664(local_b40);
                auVar72 = ZEXT1664(local_b50);
              }
              else {
                auVar46 = vmulps_avx512vl(auVar52,auVar54);
                auVar41 = vmulps_avx512vl(auVar51,auVar55);
                auVar42 = vmulps_avx512vl(auVar61,auVar53);
                auVar47 = vmulps_avx512vl(auVar55,auVar57);
                auVar48 = vmulps_avx512vl(auVar53,auVar58);
                auVar49 = vmulps_avx512vl(auVar54,auVar56);
                auVar61 = vfmsub213ps_avx512vl(auVar61,auVar55,auVar46);
                auVar50 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar41);
                auVar51 = vfmsub213ps_avx512vl(auVar51,auVar54,auVar42);
                auVar52 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar47);
                auVar54 = vfmsub213ps_avx512vl(auVar56,auVar55,auVar48);
                auVar53 = vfmsub213ps_avx512vl(auVar57,auVar53,auVar49);
                vandps_avx512vl(auVar46,local_a20);
                vandps_avx512vl(auVar47,local_a20);
                uVar27 = vcmpps_avx512vl(auVar53,auVar53,1);
                vandps_avx512vl(auVar41,local_a20);
                vandps_avx512vl(auVar48,local_a20);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                uVar23 = vcmpps_avx512vl(auVar53,auVar53,1);
                vandps_avx512vl(auVar42,local_a20);
                vandps_avx512vl(auVar49,local_a20);
                uVar20 = vcmpps_avx512vl(auVar46,auVar46,1);
                bVar17 = (bool)((byte)uVar27 & 1);
                local_960._0_4_ =
                     (float)((uint)bVar17 * auVar61._0_4_ | (uint)!bVar17 * auVar52._0_4_);
                bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
                local_960._4_4_ =
                     (float)((uint)bVar17 * auVar61._4_4_ | (uint)!bVar17 * auVar52._4_4_);
                bVar17 = (bool)((byte)(uVar27 >> 2) & 1);
                local_960._8_4_ =
                     (float)((uint)bVar17 * auVar61._8_4_ | (uint)!bVar17 * auVar52._8_4_);
                bVar17 = (bool)((byte)(uVar27 >> 3) & 1);
                local_960._12_4_ =
                     (float)((uint)bVar17 * auVar61._12_4_ | (uint)!bVar17 * auVar52._12_4_);
                bVar17 = (bool)((byte)(uVar27 >> 4) & 1);
                local_960._16_4_ =
                     (float)((uint)bVar17 * auVar61._16_4_ | (uint)!bVar17 * auVar52._16_4_);
                bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                local_960._20_4_ =
                     (float)((uint)bVar17 * auVar61._20_4_ | (uint)!bVar17 * auVar52._20_4_);
                bVar17 = (bool)((byte)(uVar27 >> 6) & 1);
                local_960._24_4_ =
                     (float)((uint)bVar17 * auVar61._24_4_ | (uint)!bVar17 * auVar52._24_4_);
                bVar17 = SUB81(uVar27 >> 7,0);
                local_960._28_4_ = (uint)bVar17 * auVar61._28_4_ | (uint)!bVar17 * auVar52._28_4_;
                bVar17 = (bool)((byte)uVar23 & 1);
                local_940._0_4_ =
                     (float)((uint)bVar17 * auVar50._0_4_ | (uint)!bVar17 * auVar54._0_4_);
                bVar17 = (bool)((byte)(uVar23 >> 1) & 1);
                local_940._4_4_ =
                     (float)((uint)bVar17 * auVar50._4_4_ | (uint)!bVar17 * auVar54._4_4_);
                bVar17 = (bool)((byte)(uVar23 >> 2) & 1);
                local_940._8_4_ =
                     (float)((uint)bVar17 * auVar50._8_4_ | (uint)!bVar17 * auVar54._8_4_);
                bVar17 = (bool)((byte)(uVar23 >> 3) & 1);
                local_940._12_4_ =
                     (float)((uint)bVar17 * auVar50._12_4_ | (uint)!bVar17 * auVar54._12_4_);
                bVar17 = (bool)((byte)(uVar23 >> 4) & 1);
                local_940._16_4_ =
                     (float)((uint)bVar17 * auVar50._16_4_ | (uint)!bVar17 * auVar54._16_4_);
                bVar17 = (bool)((byte)(uVar23 >> 5) & 1);
                local_940._20_4_ =
                     (float)((uint)bVar17 * auVar50._20_4_ | (uint)!bVar17 * auVar54._20_4_);
                bVar17 = (bool)((byte)(uVar23 >> 6) & 1);
                local_940._24_4_ =
                     (float)((uint)bVar17 * auVar50._24_4_ | (uint)!bVar17 * auVar54._24_4_);
                bVar17 = SUB81(uVar23 >> 7,0);
                local_940._28_4_ = (uint)bVar17 * auVar50._28_4_ | (uint)!bVar17 * auVar54._28_4_;
                bVar17 = (bool)((byte)uVar20 & 1);
                local_920._0_4_ =
                     (float)((uint)bVar17 * auVar51._0_4_ | (uint)!bVar17 * auVar53._0_4_);
                bVar17 = (bool)((byte)(uVar20 >> 1) & 1);
                local_920._4_4_ =
                     (float)((uint)bVar17 * auVar51._4_4_ | (uint)!bVar17 * auVar53._4_4_);
                bVar17 = (bool)((byte)(uVar20 >> 2) & 1);
                local_920._8_4_ =
                     (float)((uint)bVar17 * auVar51._8_4_ | (uint)!bVar17 * auVar53._8_4_);
                bVar17 = (bool)((byte)(uVar20 >> 3) & 1);
                local_920._12_4_ =
                     (float)((uint)bVar17 * auVar51._12_4_ | (uint)!bVar17 * auVar53._12_4_);
                bVar17 = (bool)((byte)(uVar20 >> 4) & 1);
                local_920._16_4_ =
                     (float)((uint)bVar17 * auVar51._16_4_ | (uint)!bVar17 * auVar53._16_4_);
                bVar17 = (bool)((byte)(uVar20 >> 5) & 1);
                local_920._20_4_ =
                     (float)((uint)bVar17 * auVar51._20_4_ | (uint)!bVar17 * auVar53._20_4_);
                bVar17 = (bool)((byte)(uVar20 >> 6) & 1);
                local_920._24_4_ =
                     (float)((uint)bVar17 * auVar51._24_4_ | (uint)!bVar17 * auVar53._24_4_);
                bVar17 = SUB81(uVar20 >> 7,0);
                local_920._28_4_ = (uint)bVar17 * auVar51._28_4_ | (uint)!bVar17 * auVar53._28_4_;
                auVar56._4_4_ = fVar7 * local_920._4_4_;
                auVar56._0_4_ = fVar7 * local_920._0_4_;
                auVar56._8_4_ = fVar7 * local_920._8_4_;
                auVar56._12_4_ = fVar7 * local_920._12_4_;
                auVar56._16_4_ = fVar7 * local_920._16_4_;
                auVar56._20_4_ = fVar7 * local_920._20_4_;
                auVar56._24_4_ = fVar7 * local_920._24_4_;
                auVar56._28_4_ = fVar7;
                auVar35 = vfmadd213ps_fma(auVar73,local_940,auVar56);
                auVar35 = vfmadd213ps_fma(auVar70,local_960,ZEXT1632(auVar35));
                auVar41 = ZEXT1632(CONCAT412(auVar35._12_4_ + auVar35._12_4_,
                                             CONCAT48(auVar35._8_4_ + auVar35._8_4_,
                                                      CONCAT44(auVar35._4_4_ + auVar35._4_4_,
                                                               auVar35._0_4_ + auVar35._0_4_))));
                auVar57._0_4_ = auVar44._0_4_ * local_920._0_4_;
                auVar57._4_4_ = auVar44._4_4_ * local_920._4_4_;
                auVar57._8_4_ = auVar44._8_4_ * local_920._8_4_;
                auVar57._12_4_ = auVar44._12_4_ * local_920._12_4_;
                auVar57._16_4_ = auVar44._16_4_ * local_920._16_4_;
                auVar57._20_4_ = auVar44._20_4_ * local_920._20_4_;
                auVar57._24_4_ = auVar44._24_4_ * local_920._24_4_;
                auVar57._28_4_ = 0;
                auVar35 = vfmadd213ps_fma(auVar43,local_940,auVar57);
                auVar40 = vfmadd213ps_fma(auVar62,local_960,ZEXT1632(auVar35));
                auVar62 = vrcp14ps_avx512vl(auVar41);
                auVar61 = vfnmadd213ps_avx512vl(auVar62,auVar41,auVar45);
                auVar35 = vfmadd132ps_fma(auVar61,auVar62,auVar62);
                local_8a0 = ZEXT1632(CONCAT412((auVar40._12_4_ + auVar40._12_4_) * auVar35._12_4_,
                                               CONCAT48((auVar40._8_4_ + auVar40._8_4_) *
                                                        auVar35._8_4_,
                                                        CONCAT44((auVar40._4_4_ + auVar40._4_4_) *
                                                                 auVar35._4_4_,
                                                                 (auVar40._0_4_ + auVar40._0_4_) *
                                                                 auVar35._0_4_))));
                uVar67 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar62._4_4_ = uVar67;
                auVar62._0_4_ = uVar67;
                auVar62._8_4_ = uVar67;
                auVar62._12_4_ = uVar67;
                auVar62._16_4_ = uVar67;
                auVar62._20_4_ = uVar67;
                auVar62._24_4_ = uVar67;
                auVar62._28_4_ = uVar67;
                uVar18 = vcmpps_avx512vl(local_8a0,auVar62,0xd);
                auVar62 = vxorps_avx512vl(auVar41,auVar46);
                fVar7 = ray->tfar;
                auVar61._4_4_ = fVar7;
                auVar61._0_4_ = fVar7;
                auVar61._8_4_ = fVar7;
                auVar61._12_4_ = fVar7;
                auVar61._16_4_ = fVar7;
                auVar61._20_4_ = fVar7;
                auVar61._24_4_ = fVar7;
                auVar61._28_4_ = fVar7;
                uVar19 = vcmpps_avx512vl(local_8a0,auVar61,2);
                uVar21 = vcmpps_avx512vl(auVar41,auVar62,4);
                local_900 = (byte)uVar18 & (byte)uVar19 & (byte)uVar21 & local_900;
                if (local_900 == 0) goto LAB_007156f5;
                local_820 = 0xf0;
                auVar58._8_4_ = 0x219392ef;
                auVar58._0_8_ = 0x219392ef219392ef;
                auVar58._12_4_ = 0x219392ef;
                auVar58._16_4_ = 0x219392ef;
                auVar58._20_4_ = 0x219392ef;
                auVar58._24_4_ = 0x219392ef;
                auVar58._28_4_ = 0x219392ef;
                uVar32 = vcmpps_avx512vl(local_a20,auVar58,5);
                auVar62 = vrcp14ps_avx512vl(local_980);
                auVar61 = vfnmadd213ps_avx512vl(local_980,auVar62,auVar45);
                auVar61 = vfmadd132ps_avx512vl(auVar61,auVar62,auVar62);
                fVar1 = (float)((uint)((byte)uVar32 & 1) * auVar61._0_4_);
                fVar7 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar61._4_4_);
                fVar2 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar61._8_4_);
                fVar3 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar61._12_4_);
                fVar4 = (float)((uint)((byte)(uVar32 >> 4) & 1) * auVar61._16_4_);
                fVar5 = (float)((uint)((byte)(uVar32 >> 5) & 1) * auVar61._20_4_);
                fVar6 = (float)((uint)((byte)(uVar32 >> 6) & 1) * auVar61._24_4_);
                auVar60._4_4_ = fVar7 * local_9c0._4_4_;
                auVar60._0_4_ = fVar1 * local_9c0._0_4_;
                auVar60._8_4_ = fVar2 * local_9c0._8_4_;
                auVar60._12_4_ = fVar3 * local_9c0._12_4_;
                auVar60._16_4_ = fVar4 * local_9c0._16_4_;
                auVar60._20_4_ = fVar5 * local_9c0._20_4_;
                auVar60._24_4_ = fVar6 * local_9c0._24_4_;
                auVar60._28_4_ = local_9c0._28_4_;
                auVar61 = vminps_avx512vl(auVar60,auVar45);
                auVar22._4_4_ = local_9a0._4_4_ * fVar7;
                auVar22._0_4_ = local_9a0._0_4_ * fVar1;
                auVar22._8_4_ = local_9a0._8_4_ * fVar2;
                auVar22._12_4_ = local_9a0._12_4_ * fVar3;
                auVar22._16_4_ = local_9a0._16_4_ * fVar4;
                auVar22._20_4_ = local_9a0._20_4_ * fVar5;
                auVar22._24_4_ = local_9a0._24_4_ * fVar6;
                auVar22._28_4_ = auVar62._28_4_;
                auVar62 = vminps_avx512vl(auVar22,auVar45);
                auVar46 = vsubps_avx512vl(auVar45,auVar61);
                auVar45 = vsubps_avx512vl(auVar45,auVar62);
                local_8c0 = vblendps_avx(auVar62,auVar46,0xf0);
                local_8e0 = vblendps_avx(auVar61,auVar45,0xf0);
                fVar7 = (float)DAT_02060940;
                fVar6 = DAT_02060940._4_4_;
                local_880._4_4_ = local_960._4_4_ * fVar6;
                local_880._0_4_ = local_960._0_4_ * fVar7;
                fVar5 = DAT_02060940._8_4_;
                local_880._8_4_ = local_960._8_4_ * fVar5;
                fVar4 = DAT_02060940._12_4_;
                local_880._12_4_ = local_960._12_4_ * fVar4;
                fVar3 = DAT_02060940._16_4_;
                local_880._16_4_ = local_960._16_4_ * fVar3;
                fVar2 = DAT_02060940._20_4_;
                local_880._20_4_ = local_960._20_4_ * fVar2;
                fVar1 = DAT_02060940._24_4_;
                local_880._24_4_ = local_960._24_4_ * fVar1;
                local_880._28_4_ = local_960._28_4_;
                local_860._4_4_ = local_940._4_4_ * fVar6;
                local_860._0_4_ = local_940._0_4_ * fVar7;
                local_860._8_4_ = local_940._8_4_ * fVar5;
                local_860._12_4_ = local_940._12_4_ * fVar4;
                local_860._16_4_ = local_940._16_4_ * fVar3;
                local_860._20_4_ = local_940._20_4_ * fVar2;
                local_860._24_4_ = local_940._24_4_ * fVar1;
                local_860._28_4_ = local_940._28_4_;
                local_840._4_4_ = local_920._4_4_ * fVar6;
                local_840._0_4_ = local_920._0_4_ * fVar7;
                local_840._8_4_ = local_920._8_4_ * fVar5;
                local_840._12_4_ = local_920._12_4_ * fVar4;
                local_840._16_4_ = local_920._16_4_ * fVar3;
                local_840._20_4_ = local_920._20_4_ * fVar2;
                local_840._24_4_ = local_920._24_4_ * fVar1;
                local_840._28_4_ = local_920._28_4_;
                uVar27 = (ulong)local_900;
                auVar77 = ZEXT1664(local_b20);
                auVar79 = ZEXT1664(local_b30);
                auVar71 = ZEXT1664(local_b40);
                auVar72 = ZEXT1664(local_b50);
                do {
                  uVar32 = 0;
                  for (uVar33 = uVar27; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000
                      ) {
                    uVar32 = uVar32 + 1;
                  }
                  local_ac8 = *(uint *)((long)&local_9e0 + uVar32 * 4);
                  pGVar15 = (pSVar9->geometries).items[local_ac8].ptr;
                  if ((pGVar15->mask & ray->mask) == 0) {
                    uVar27 = uVar27 ^ 1L << (uVar32 & 0x3f);
                    bVar17 = true;
                  }
                  else {
                    pRVar16 = local_b68->args;
                    if ((pRVar16->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar17 = false;
                    }
                    else {
                      uVar33 = (ulong)(uint)((int)uVar32 * 4);
                      local_ab0.context = local_b68->user;
                      local_ae0 = *(undefined4 *)(local_880 + uVar33);
                      local_adc = *(undefined4 *)(local_860 + uVar33);
                      local_ad8 = *(undefined4 *)(local_840 + uVar33);
                      local_ad4 = *(undefined4 *)(local_8e0 + uVar33);
                      local_ad0 = *(undefined4 *)(local_8c0 + uVar33);
                      local_acc = *(undefined4 *)((long)&local_a00 + uVar33);
                      local_ac4 = (local_ab0.context)->instID[0];
                      local_ac0 = (local_ab0.context)->instPrimID[0];
                      local_a20._0_4_ = ray->tfar;
                      ray->tfar = *(float *)(local_8a0 + uVar33);
                      local_b74 = -1;
                      local_ab0.valid = &local_b74;
                      local_ab0.geometryUserPtr = pGVar15->userPtr;
                      local_ab0.ray = (RTCRayN *)ray;
                      local_ab0.hit = (RTCHitN *)&local_ae0;
                      local_ab0.N = 1;
                      local_a30 = auVar81._0_16_;
                      local_a40 = auVar82._0_16_;
                      local_a50 = auVar83._0_16_;
                      local_a60 = auVar84._0_16_;
                      local_a70 = auVar85._0_16_;
                      local_a80 = auVar86._0_16_;
                      if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007155f7:
                        if (pRVar16->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar16->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar16->filter)(&local_ab0);
                            auVar72 = ZEXT1664(local_b50);
                            auVar71 = ZEXT1664(local_b40);
                            auVar79 = ZEXT1664(local_b30);
                            auVar77 = ZEXT1664(local_b20);
                            auVar86 = ZEXT1664(local_a80);
                            auVar85 = ZEXT1664(local_a70);
                            auVar84 = ZEXT1664(local_a60);
                            auVar83 = ZEXT1664(local_a50);
                            auVar82 = ZEXT1664(local_a40);
                            auVar81 = ZEXT1664(local_a30);
                            fVar64 = local_b10;
                            fVar74 = fStack_b0c;
                            fVar75 = fStack_b08;
                            fVar76 = fStack_b04;
                          }
                          if (*local_ab0.valid == 0) goto LAB_0071569f;
                        }
                        bVar17 = false;
                      }
                      else {
                        local_b00 = uVar30;
                        local_af8 = ray;
                        (*pGVar15->occlusionFilterN)(&local_ab0);
                        auVar72 = ZEXT1664(local_b50);
                        auVar71 = ZEXT1664(local_b40);
                        auVar79 = ZEXT1664(local_b30);
                        auVar77 = ZEXT1664(local_b20);
                        auVar86 = ZEXT1664(local_a80);
                        auVar85 = ZEXT1664(local_a70);
                        auVar84 = ZEXT1664(local_a60);
                        auVar83 = ZEXT1664(local_a50);
                        auVar82 = ZEXT1664(local_a40);
                        auVar81 = ZEXT1664(local_a30);
                        ray = local_af8;
                        uVar30 = local_b00;
                        fVar64 = local_b10;
                        fVar74 = fStack_b0c;
                        fVar75 = fStack_b08;
                        fVar76 = fStack_b04;
                        if (*local_ab0.valid != 0) goto LAB_007155f7;
LAB_0071569f:
                        ray->tfar = (float)local_a20._0_4_;
                        uVar27 = uVar27 ^ 1L << (uVar32 & 0x3f);
                        bVar17 = true;
                      }
                    }
                  }
                  iVar31 = 0;
                  uVar32 = local_b58;
                  uVar33 = local_b60;
                  if (!bVar17) {
                    if (bVar34) {
                      ray->tfar = -INFINITY;
                      iVar31 = 3;
                    }
                    goto LAB_00715748;
                  }
                } while (uVar27 != 0);
              }
              iVar31 = 0;
              local_ae8 = local_ae8 + 1;
              bVar34 = local_ae8 < local_af0;
            } while (local_ae8 != local_af0);
          }
        }
LAB_00715748:
      } while (iVar31 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }